

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_avg.cpp
# Opt level: O2

AggregateFunction * duckdb::RegrAvgxFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType LStack_58;
  LogicalType local_40;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LogicalType(&LStack_58,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrState,double,double,double,duckdb::RegrAvgXFunction,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,&local_40,&LStack_58,in_R8);
  LogicalType::~LogicalType(&LStack_58);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction RegrAvgxFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrState, double, double, double, RegrAvgXFunction>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}